

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx *dctx,ZSTD_dParameter param,int *value)

{
  U32 UVar1;
  int *value_local;
  ZSTD_dParameter param_local;
  ZSTD_DCtx *dctx_local;
  
  if (param == ZSTD_d_windowLogMax) {
    UVar1 = ZSTD_highbit32((U32)dctx->maxWindowSize);
    *value = UVar1;
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else if (param == ZSTD_d_experimentalParam1) {
    *value = dctx->format;
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else if (param == ZSTD_d_experimentalParam2) {
    *value = dctx->outBufferMode;
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else if (param == ZSTD_d_experimentalParam3) {
    *value = dctx->forceIgnoreChecksum;
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else if (param == ZSTD_d_experimentalParam4) {
    *value = dctx->refMultipleDDicts;
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffd8;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx* dctx, ZSTD_dParameter param, int* value)
{
    switch (param) {
        case ZSTD_d_windowLogMax:
            *value = (int)ZSTD_highbit32((U32)dctx->maxWindowSize);
            return 0;
        case ZSTD_d_format:
            *value = (int)dctx->format;
            return 0;
        case ZSTD_d_stableOutBuffer:
            *value = (int)dctx->outBufferMode;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            *value = (int)dctx->forceIgnoreChecksum;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            *value = (int)dctx->refMultipleDDicts;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}